

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferImpl.h
# Opt level: O2

bool __thiscall
ViconCGStreamIO::VBufferImpl::ReadPod<unsigned_int>(VBufferImpl *this,uint *o_rValue)

{
  ulong uVar1;
  pointer puVar2;
  ulong uVar3;
  
  uVar1 = (ulong)this->m_Offset + 4;
  puVar2 = (this->m_Buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(this->m_Buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  if (uVar1 <= uVar3) {
    *o_rValue = *(uint *)(puVar2 + this->m_Offset);
    this->m_Offset = this->m_Offset + 4;
  }
  return uVar1 <= uVar3;
}

Assistant:

bool ReadPod( T & o_rValue ) const
  {
   const size_t sizeOfT = sizeof( T );

   if( m_Offset + sizeOfT > m_Buffer.size() )
   {
     return false;
   }

   memcpy( &o_rValue, &m_Buffer[ 0 ] + m_Offset, sizeOfT );
   m_Offset += sizeOfT;
   return true;
  }